

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1e75e5::LaneBasedExecutionQueue::killAfterTimeout(LaneBasedExecutionQueue *this)

{
  char *pcVar1;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->queueCompleteMutex);
  if (this->queueComplete == false) {
    pcVar1 = getenv("LLBUILD_TEST");
    if (pcVar1 == (char *)0x0) {
      local_20.__r = 10;
      std::condition_variable::wait_for<long,std::ratio<1l,1l>>
                (&this->queueCompleteCondition,&lock,
                 (duration<long,_std::ratio<1L,_1L>_> *)&local_20);
    }
    else {
      local_20.__r = 1000;
      std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
                (&this->queueCompleteCondition,&lock,&local_20);
    }
    llbuild::basic::ProcessGroup::signalAll(&this->spawnedProcesses,9);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void killAfterTimeout() {
    std::unique_lock<std::mutex> lock(queueCompleteMutex);

    if (!queueComplete) {
      // Shorten timeout if in testing context
      if (getenv("LLBUILD_TEST") != nullptr) {
        queueCompleteCondition.wait_for(lock, std::chrono::milliseconds(1000));
      } else {
        queueCompleteCondition.wait_for(lock, std::chrono::seconds(10));
      }

#if _WIN32
      spawnedProcesses.signalAll(SIGTERM);
#else
      spawnedProcesses.signalAll(SIGKILL);
#endif
    }
  }